

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O2

elem * cilkred_map::grow(__cilkrts_worker *w,bucket **bp)

{
  elem *peVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  bucket *pbVar4;
  undefined8 uVar5;
  elem *peVar6;
  size_t sVar7;
  ulong uVar8;
  bucket *pbVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  elem *peVar13;
  bool bVar14;
  
  pbVar4 = *bp;
  if (pbVar4 == (bucket *)0x0) {
    uVar12 = 0;
LAB_0010acb4:
    sVar7 = __cilkrts_frame_malloc_roundup(uVar12 * 0x30 + 0x20);
    uVar8 = (sVar7 - 0x20) / 0x18;
    pbVar9 = (bucket *)__cilkrts_frame_malloc(w,uVar8 * 0x18 + 0x20);
    pbVar9->nmax = uVar8;
    lVar10 = 8;
    uVar11 = uVar12;
    while (bVar14 = uVar11 != 0, uVar11 = uVar11 - 1, bVar14) {
      *(undefined8 *)((long)&pbVar9->el[0].hb + lVar10) =
           *(undefined8 *)((long)&pbVar4->el[0].hb + lVar10);
      puVar2 = (undefined8 *)((long)pbVar4->el + lVar10 + -8);
      uVar5 = puVar2[1];
      puVar3 = (undefined8 *)((long)pbVar9->el + lVar10 + -8);
      *puVar3 = *puVar2;
      puVar3[1] = uVar5;
      lVar10 = lVar10 + 0x18;
    }
    free_bucket(w,bp);
    *bp = pbVar9;
    peVar6 = pbVar9->el + uVar12;
    for (uVar11 = uVar12; peVar6->key = (void *)0x0, uVar11 < uVar8; uVar11 = uVar11 + 1) {
      peVar6 = peVar6 + 1;
    }
    peVar13 = pbVar9->el + uVar12;
  }
  else {
    uVar12 = pbVar4->nmax;
    uVar11 = 0xffffffffffffffff;
    peVar6 = (elem *)&pbVar4[-1].el[0].hb;
    do {
      uVar11 = uVar11 + 1;
      if (uVar12 == uVar11) goto LAB_0010acb4;
      peVar13 = peVar6 + 1;
      peVar1 = peVar6 + 1;
      peVar6 = peVar13;
    } while (peVar1->key != (void *)0x0);
  }
  return peVar13;
}

Assistant:

elem *cilkred_map::grow(__cilkrts_worker *w, 
                        bucket          **bp)
{
    size_t i, nmax, nnmax;
    bucket *b, *nb;

    b = *bp;
    if (b) {
        nmax = b->nmax;
        /* find empty element if any */
        for (i = 0; i < nmax; ++i) 
            if (b->el[i].key == 0) 
                return &(b->el[i]);
        /* do not use the last one even if empty */
    } else {
        nmax = 0;
    }

    verify_current_wkr(w);
    /* allocate a new bucket */
    nnmax = roundup(2 * nmax);
    nb = alloc_bucket(w, nnmax);


    /* copy old bucket into new */
    for (i = 0; i < nmax; ++i)
        nb->el[i] = b->el[i];
     
    free_bucket(w, bp); *bp = nb;

    /* zero out extra elements */
    for (; i < nnmax; ++i)
        nb->el[i].key = 0;

    /* zero out the last one */
    nb->el[i].key = 0;
  
    return &(nb->el[nmax]);
}